

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMDocumentImpl::deleteHeap(DOMDocumentImpl *this)

{
  void *pvVar1;
  void *nextBlock_1;
  void *nextBlock;
  DOMDocumentImpl *this_local;
  
  while (this->fCurrentBlock != (void *)0x0) {
    pvVar1 = *this->fCurrentBlock;
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fCurrentBlock);
    this->fCurrentBlock = pvVar1;
  }
  while (this->fCurrentSingletonBlock != (void *)0x0) {
    pvVar1 = *this->fCurrentSingletonBlock;
    (*this->fMemoryManager->_vptr_MemoryManager[4])
              (this->fMemoryManager,this->fCurrentSingletonBlock);
    this->fCurrentSingletonBlock = pvVar1;
  }
  return;
}

Assistant:

void DOMDocumentImpl::deleteHeap()
{
    while (fCurrentBlock != 0)
    {
        void *nextBlock = *(void **)fCurrentBlock;
        fMemoryManager->deallocate(fCurrentBlock);
        fCurrentBlock = nextBlock;
    }
    while (fCurrentSingletonBlock != 0)
    {
        void *nextBlock = *(void **)fCurrentSingletonBlock;
        fMemoryManager->deallocate(fCurrentSingletonBlock);
        fCurrentSingletonBlock = nextBlock;
    }
}